

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

void __thiscall toml::internal::Parser::Parser(Parser *this,istream *is)

{
  bool bVar1;
  allocator local_79;
  string local_78;
  undefined1 local_58 [64];
  
  (this->lexer_).is_ = is;
  (this->lexer_).lineNo_ = 1;
  (this->token_).type_ = ERROR_TOKEN;
  (this->token_).str_value_._M_dataplus._M_p = (pointer)&(this->token_).str_value_.field_2;
  (this->token_).str_value_._M_string_length = 0;
  (this->token_).str_value_.field_2._M_local_buf[0] = '\0';
  (this->token_).time_value_.__d.__r = 0;
  (this->errorReason_)._M_dataplus._M_p = (pointer)&(this->errorReason_).field_2;
  (this->errorReason_)._M_string_length = 0;
  (this->errorReason_).field_2._M_local_buf[0] = '\0';
  bVar1 = Lexer::skipUTF8BOM(&this->lexer_);
  if (bVar1) {
    nextKey(this);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,"Invalid UTF8 BOM",&local_79);
    Token::Token((Token *)local_58,ERROR_TOKEN,&local_78);
    Token::operator=(&this->token_,(Token *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

explicit Parser(std::istream& is) : lexer_(is), token_(TokenType::ERROR_TOKEN)
    {
        if (!lexer_.skipUTF8BOM()) {
            token_ = Token(TokenType::ERROR_TOKEN, std::string("Invalid UTF8 BOM"));
        } else {
            nextKey();
        }
    }